

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Matchers::StdString::RegexMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,RegexMatcher *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_38,&this->m_regex);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x17fecc);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RegexMatcher::describe() const {
            return "matches " + ::Catch::Detail::stringify(m_regex) + ((m_caseSensitivity == CaseSensitive::Choice::Yes)? " case sensitively" : " case insensitively");
        }